

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

void __thiscall testing::internal::StreamingListener::Start(StreamingListener *this)

{
  allocator local_31;
  string local_30;
  StreamingListener *local_10;
  StreamingListener *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"gtest_streaming_protocol_version=1.0",&local_31)
  ;
  SendLn(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

void Start() { SendLn("gtest_streaming_protocol_version=1.0"); }